

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O0

int * Pdr_ManSortByPriority(Pdr_Man_t *p,Pdr_Set_t *pCube)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int local_38;
  int nSize;
  int best_i;
  int j;
  int i;
  int temp;
  int *pArray;
  int *pPrios;
  Pdr_Set_t *pCube_local;
  Pdr_Man_t *p_local;
  
  piVar4 = Vec_IntArray(p->vPrio);
  piVar3 = p->pOrder;
  iVar1 = pCube->nLits;
  for (best_i = 0; best_i < iVar1; best_i = best_i + 1) {
    piVar3[best_i] = best_i;
  }
  for (best_i = 0; best_i < iVar1 + -1; best_i = best_i + 1) {
    local_38 = best_i;
    nSize = best_i;
    while (nSize = nSize + 1, nSize < iVar1) {
      if (piVar4[*(int *)(&pCube->field_0x14 + (long)piVar3[nSize] * 4) >> 1] <
          piVar4[*(int *)(&pCube->field_0x14 + (long)piVar3[local_38] * 4) >> 1]) {
        local_38 = nSize;
      }
    }
    iVar2 = piVar3[best_i];
    piVar3[best_i] = piVar3[local_38];
    piVar3[local_38] = iVar2;
  }
  return piVar3;
}

Assistant:

int * Pdr_ManSortByPriority( Pdr_Man_t * p, Pdr_Set_t * pCube )
{
    int * pPrios = Vec_IntArray(p->vPrio);
    int * pArray = p->pOrder;
    int temp, i, j, best_i, nSize = pCube->nLits;
    // initialize variable order
    for ( i = 0; i < nSize; i++ )
        pArray[i] = i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
//            if ( pArray[j] < pArray[best_i] )
            if ( pPrios[pCube->Lits[pArray[j]]>>1] < pPrios[pCube->Lits[pArray[best_i]]>>1] ) // list lower priority first (these will be removed first)
                best_i = j;
        temp = pArray[i];
        pArray[i] = pArray[best_i];
        pArray[best_i] = temp;
    }
/*
    for ( i = 0; i < pCube->nLits; i++ )
        Abc_Print( 1, "%2d : %5d    %5d  %5d\n", i, pArray[i], pCube->Lits[pArray[i]]>>1, pPrios[pCube->Lits[pArray[i]]>>1] );
    Abc_Print( 1, "\n" );
*/
    return pArray;
}